

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

double __thiscall despot::Parser::LogNumInitialStates(Parser *this)

{
  int iVar1;
  size_type sVar2;
  reference this_00;
  const_reference pvVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  uint local_2c;
  double dStack_28;
  int v;
  double n;
  double dStack_18;
  int s;
  double log_num_states;
  Parser *this_local;
  
  dStack_18 = 0.0;
  n._4_4_ = 0;
  while( true ) {
    sVar2 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::size
                      (&this->curr_state_vars_);
    if (sVar2 <= (ulong)(long)n._4_4_) break;
    dStack_28 = 0.0;
    local_2c = 0;
    while( true ) {
      this_00 = std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::operator[]
                          (&this->curr_state_vars_,(long)n._4_4_);
      iVar1 = Variable::Size((Variable *)this_00);
      if (iVar1 <= (int)local_2c) break;
      pvVar3 = std::vector<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>::operator[]
                         (&this->initial_belief_funcs_,(long)n._4_4_);
      (*(pvVar3->super_CPT).super_Function._vptr_Function[4])(pvVar3,0,(ulong)local_2c);
      dStack_28 = (double)(0.0 < extraout_XMM0_Qa) + dStack_28;
      local_2c = local_2c + 1;
    }
    dVar4 = log2(dStack_28);
    dStack_18 = dVar4 + dStack_18;
    n._4_4_ = n._4_4_ + 1;
  }
  return dStack_18;
}

Assistant:

double Parser::LogNumInitialStates() const {
	double log_num_states = 0;

	for (int s = 0; s < curr_state_vars_.size(); s++) {
		double n = 0;
		for (int v = 0; v < curr_state_vars_[s].Size(); v++)
			n += (initial_belief_funcs_[s].GetValue(0, v) > 0);
		log_num_states += log2(n);
	}

	return log_num_states;
}